

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

void __thiscall RenX::Server::sendPubChan(Server *this,string_view msg)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  long lVar5;
  undefined8 uVar6;
  __sv_type _Var7;
  long local_80;
  size_t i_1;
  char *local_70;
  long local_68;
  size_t i;
  undefined1 local_50 [8];
  string message;
  string_view prefix;
  Server *this_local;
  string_view msg_local;
  
  msg_local._M_len = (size_t)msg._M_str;
  this_local = (Server *)msg._M_len;
  join_0x00000010_0x00000000_ = getPrefix(this);
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     ((long)&message.field_2 + 8));
  if (bVar2) {
    local_80 = 0;
    while( true ) {
      lVar5 = ServerManager::size();
      if (local_80 == lVar5) break;
      uVar6 = ServerManager::getServer(_serverManager);
      Jupiter::IRC::Client::messageChannels(uVar6,this->m_logChanType,this_local,msg_local._M_len);
      local_80 = local_80 + 1;
    }
  }
  else {
    std::__cxx11::string::string((string *)local_50);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       ((long)&message.field_2 + 8));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
               sVar3 + 1 + sVar4);
    std::__cxx11::string::operator=
              ((string *)local_50,
               (basic_string_view<char,_std::char_traits<char>_> *)((long)&message.field_2 + 8));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,' ');
    std::__cxx11::string::operator+=
              ((string *)local_50,(basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    local_68 = 0;
    while( true ) {
      lVar5 = ServerManager::size();
      if (local_68 == lVar5) break;
      uVar6 = ServerManager::getServer(_serverManager);
      iVar1 = this->m_logChanType;
      _Var7 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
      i_1 = _Var7._M_len;
      local_70 = _Var7._M_str;
      Jupiter::IRC::Client::messageChannels(uVar6,iVar1,i_1,local_70);
      local_68 = local_68 + 1;
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void RenX::Server::sendPubChan(std::string_view msg) const {
	std::string_view prefix = getPrefix();
	if (!prefix.empty()) {
		std::string message;
		message.reserve(msg.size() + prefix.size() + 1);
		message = prefix;
		message += ' ';
		message += msg;
		for (size_t i = 0; i != serverManager->size(); i++) {
			serverManager->getServer(i)->messageChannels(m_logChanType, message);
		}

		return;
	}

	for (size_t i = 0; i != serverManager->size(); i++) {
		serverManager->getServer(i)->messageChannels(m_logChanType, msg);
	}
}